

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O0

bool Grammar::is_vector_type(string *str)

{
  undefined1 uVar1;
  bool bVar2;
  string *in_RDI;
  undefined6 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff26;
  undefined1 in_stack_ffffffffffffff27;
  string *in_stack_ffffffffffffff28;
  allocator *suffix;
  undefined6 in_stack_ffffffffffffff38;
  byte bVar3;
  allocator *str_00;
  string local_b0 [32];
  string local_90 [37];
  byte local_6b;
  byte local_6a;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  string *local_10;
  byte local_1;
  
  str_00 = &local_31;
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  local_6a = 0;
  local_6b = 0;
  std::__cxx11::string::string(local_30,"Vector<",str_00);
  uVar1 = str_utils::starts_with
                    (in_stack_ffffffffffffff28,
                     (string *)
                     CONCAT17(in_stack_ffffffffffffff27,
                              CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
  bVar3 = 1;
  if ((bool)uVar1) {
    suffix = &local_69;
    std::allocator<char>::allocator();
    local_6a = 1;
    std::__cxx11::string::string(local_68,">",suffix);
    local_6b = 1;
    bVar2 = str_utils::ends_with
                      ((string *)CONCAT17(uVar1,CONCAT16(bVar3,in_stack_ffffffffffffff38)),
                       (string *)suffix);
    bVar3 = bVar2 ^ 0xff;
  }
  if ((local_6b & 1) != 0) {
    std::__cxx11::string::~string(local_68);
  }
  if ((local_6a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if ((bVar3 & 1) == 0) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_b0,(ulong)local_10);
    str_utils::trim((string *)str_00);
    local_1 = is_object_type(local_10);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string(local_b0);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool Grammar::is_vector_type(const std::string& str) {
    if (!str_utils::starts_with(str, "Vector<") || !str_utils::ends_with(str, ">"))
        return false;
    return is_object_type(str_utils::trim(str.substr(7, int(str.size()) - 8)));
}